

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::SnapshotEventLogEntry_UnloadEventMemory
               (EventLogEntry *evt,UnlinkableSlabAllocator *alloc)

{
  if (evt->EventKind == SnapshotTag) {
    if (evt[2].EventKind != Invalid) {
      SlabAllocatorBase<8>::UnlinkAllocation(alloc,(void *)evt[2].EventTimeStamp);
    }
    if (evt[3].EventKind != Invalid) {
      SlabAllocatorBase<8>::UnlinkAllocation(alloc,(void *)evt[3].EventTimeStamp);
    }
    SnapshotEventLogEntry_UnloadSnapshot(evt);
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void SnapshotEventLogEntry_UnloadEventMemory(EventLogEntry* evt, UnlinkableSlabAllocator& alloc)
        {
            SnapshotEventLogEntry* snapEvt = GetInlineEventDataAs<SnapshotEventLogEntry, EventKind::SnapshotTag>(evt);

            if(snapEvt->LiveContextCount != 0)
            {
                alloc.UnlinkAllocation(snapEvt->LiveContextIdArray);
            }

            if(snapEvt->LongLivedRefRootsCount != 0)
            {
                alloc.UnlinkAllocation(snapEvt->LongLivedRefRootsIdArray);
            }

            SnapshotEventLogEntry_UnloadSnapshot(evt);
        }